

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BigInt.cpp
# Opt level: O0

BigInt * __thiscall
BigInt::karatsuba(BigInt *__return_storage_ptr__,BigInt *this,BigInt *a,BigInt *b)

{
  int end;
  int *piVar1;
  BigInt local_218;
  int *local_1f8;
  value_type_conflict1 local_1ec;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> local_1e8;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> local_1e0;
  const_iterator local_1d8;
  int *local_1d0;
  value_type_conflict1 local_1c4;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> local_1c0;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> local_1b8;
  const_iterator local_1b0;
  BigInt local_1a8;
  BigInt local_188;
  undefined1 local_168 [8];
  BigInt z1;
  BigInt local_128;
  undefined1 local_108 [8];
  BigInt z0;
  BigInt z2;
  BigInt cc;
  BigInt dd;
  undefined1 local_78 [8];
  BigInt aa;
  BigInt bb;
  int local_30;
  int half;
  int len_b;
  int len_a;
  BigInt *b_local;
  BigInt *a_local;
  BigInt *this_local;
  
  _len_b = b;
  b_local = a;
  a_local = this;
  this_local = __return_storage_ptr__;
  half = get_real_length(a);
  local_30 = get_real_length(_len_b);
  if (((half < 500) || (local_30 < 500)) || (10 < half - local_30)) {
    simple_multiply(__return_storage_ptr__,b_local,_len_b);
  }
  else {
    piVar1 = std::min<int>(&half,&local_30);
    end = *piVar1 / 2;
    sub_value((BigInt *)&aa.real_length,b_local,1,end);
    sub_value((BigInt *)local_78,b_local,end + 1,-1);
    sub_value((BigInt *)&cc.real_length,_len_b,1,end);
    sub_value((BigInt *)&z2.real_length,_len_b,end + 1,-1);
    karatsuba((BigInt *)&z0.real_length,this,(BigInt *)local_78,(BigInt *)&z2.real_length);
    karatsuba((BigInt *)local_108,this,(BigInt *)&aa.real_length,(BigInt *)&cc.real_length);
    operator+(&local_128,(BigInt *)local_78,(BigInt *)&aa.real_length);
    operator=((BigInt *)local_78,&local_128);
    ~BigInt(&local_128);
    operator+((BigInt *)&z1.real_length,(BigInt *)&z2.real_length,(BigInt *)&cc.real_length);
    operator=((BigInt *)&z2.real_length,(BigInt *)&z1.real_length);
    ~BigInt((BigInt *)&z1.real_length);
    karatsuba((BigInt *)local_168,this,(BigInt *)local_78,(BigInt *)&z2.real_length);
    operator-(&local_1a8,(BigInt *)local_168,(BigInt *)local_108);
    operator-(&local_188,&local_1a8,(BigInt *)&z0.real_length);
    operator=((BigInt *)local_168,&local_188);
    ~BigInt(&local_188);
    ~BigInt(&local_1a8);
    local_1c0._M_current = (int *)std::vector<int,_std::allocator<int>_>::begin(&z0.real_length);
    local_1b8 = __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::
                operator+(&local_1c0,1);
    __gnu_cxx::__normal_iterator<int_const*,std::vector<int,std::allocator<int>>>::
    __normal_iterator<int*>
              ((__normal_iterator<int_const*,std::vector<int,std::allocator<int>>> *)&local_1b0,
               &local_1b8);
    local_1c4 = 0;
    local_1d0 = (int *)std::vector<int,_std::allocator<int>_>::insert
                                 ((vector<int,_std::allocator<int>_> *)&z0.real_length,local_1b0,
                                  (long)(end * 2),&local_1c4);
    local_1e8._M_current =
         (int *)std::vector<int,_std::allocator<int>_>::begin
                          ((vector<int,_std::allocator<int>_> *)local_168);
    local_1e0 = __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::
                operator+(&local_1e8,1);
    __gnu_cxx::__normal_iterator<int_const*,std::vector<int,std::allocator<int>>>::
    __normal_iterator<int*>
              ((__normal_iterator<int_const*,std::vector<int,std::allocator<int>>> *)&local_1d8,
               &local_1e0);
    local_1ec = 0;
    local_1f8 = (int *)std::vector<int,_std::allocator<int>_>::insert
                                 ((vector<int,_std::allocator<int>_> *)local_168,local_1d8,(long)end
                                  ,&local_1ec);
    operator+(&local_218,(BigInt *)&z0.real_length,(BigInt *)local_168);
    operator+(__return_storage_ptr__,&local_218,(BigInt *)local_108);
    ~BigInt(&local_218);
    ~BigInt((BigInt *)local_168);
    ~BigInt((BigInt *)local_108);
    ~BigInt((BigInt *)&z0.real_length);
    ~BigInt((BigInt *)&z2.real_length);
    ~BigInt((BigInt *)&cc.real_length);
    ~BigInt((BigInt *)local_78);
    ~BigInt((BigInt *)&aa.real_length);
  }
  return __return_storage_ptr__;
}

Assistant:

BigInt BigInt::karatsuba(BigInt& a, BigInt& b) {
    int len_a = a.get_real_length();
    int len_b = b.get_real_length();
    if (len_a < 500 || len_b < 500 || (len_a - len_b) > 10) {
        return a.simple_multiply(b);
    }
    int half = min(len_a, len_b) / 2;

    BigInt bb = a.sub_value(1, half);
    BigInt aa = a.sub_value(half + 1, -1);
    BigInt dd = b.sub_value(1, half);
    BigInt cc = b.sub_value(half + 1, -1);

    BigInt z2 = this->karatsuba(aa, cc);
    BigInt z0 = this->karatsuba(bb, dd);
    aa = aa + bb;
    cc = cc + dd;
    BigInt z1 = this->karatsuba(aa, cc);
    z1 = z1 - z0 - z2;

    z2.value.insert(z2.value.begin() + 1, 2 * half, 0);
    z1.value.insert(z1.value.begin() + 1, half, 0);

    return z2 + z1 + z0;
    ;
}